

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propd.c
# Opt level: O3

void property_init(void)

{
  char *__s;
  char *pcVar1;
  char *value;
  ushort **ppuVar2;
  ushort *puVar3;
  char *pcVar4;
  long lVar5;
  char *pcVar6;
  char *pcVar7;
  uint sz;
  uint local_2c;
  
  lVar5 = 8;
  do {
    property_set(*(char **)((long)&mount_flags[8].flag + lVar5),
                 *(char **)((long)&set_default_properties_propList + lVar5));
    lVar5 = lVar5 + 0x10;
  } while (lVar5 != 0x38);
  __s = (char *)read_file("/platform//property/default.prop",&local_2c);
  if (__s != (char *)0x0) {
    pcVar1 = strchr(__s,10);
    pcVar7 = __s;
    while (pcVar1 != (char *)0x0) {
      *pcVar1 = '\0';
      value = strchr(pcVar7,0x3d);
      if (value != (char *)0x0) {
        *value = '\0';
        ppuVar2 = __ctype_b_loc();
        puVar3 = *ppuVar2;
        pcVar7 = pcVar7 + -1;
        do {
          pcVar6 = pcVar7 + 1;
          pcVar7 = pcVar7 + 1;
        } while ((*(byte *)((long)puVar3 + (long)*pcVar6 * 2 + 1) & 0x20) != 0);
        if (*pcVar6 != '#') {
          pcVar6 = value + -1;
          if (pcVar7 < pcVar6) {
            do {
              puVar3 = *ppuVar2;
              if ((*(byte *)((long)puVar3 + (long)*pcVar6 * 2 + 1) & 0x20) == 0) goto LAB_00109352;
              *pcVar6 = '\0';
              pcVar6 = pcVar6 + -1;
            } while (pcVar7 < pcVar6);
            puVar3 = *ppuVar2;
          }
LAB_00109352:
          do {
            pcVar6 = value + 1;
            value = value + 1;
            pcVar4 = pcVar1;
          } while ((*(byte *)((long)puVar3 + (long)*pcVar6 * 2 + 1) & 0x20) != 0);
          while ((pcVar4 = pcVar4 + -1, value < pcVar4 &&
                 ((*(byte *)((long)*ppuVar2 + (long)*pcVar4 * 2 + 1) & 0x20) != 0))) {
            *pcVar4 = '\0';
          }
          property_set(pcVar7,value);
        }
      }
      pcVar7 = pcVar1 + 1;
      pcVar1 = strchr(pcVar7,10);
    }
    free(__s);
  }
  return;
}

Assistant:

void property_init(void)
{
    set_default_properties();
	load_properties_from_file(PROP_PATH_SYSTEM_DEFAULT);
}